

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.h
# Opt level: O0

string * __thiscall
soul::
addSuffixToMakeUnique<soul::Structure::addMemberWithUniqueName(soul::Type,std::__cxx11::string_const&)::__0>
          (string *__return_storage_ptr__,soul *this,string *name,anon_class_8_1_8991fb9c *isUsed)

{
  bool bVar1;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_28;
  undefined1 local_21;
  int suffix;
  anon_class_8_1_8991fb9c *isUsed_local;
  string *name_local;
  string *nameToUse;
  
  local_21 = 0;
  _suffix = name;
  isUsed_local = (anon_class_8_1_8991fb9c *)this;
  name_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  local_28 = 1;
  while (bVar1 = Structure::addMemberWithUniqueName::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)_suffix,__return_storage_ptr__), bVar1) {
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)isUsed_local
                   ,"_");
    local_28 = local_28 + 1;
    std::__cxx11::to_string(&local_98,local_28);
    std::operator+(&local_58,&local_78,&local_98);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string addSuffixToMakeUnique (const std::string& name, IsAlreadyUsedFn&& isUsed)
{
    auto nameToUse = name;
    int suffix = 1;

    while (isUsed (nameToUse))
        nameToUse = name + "_" + std::to_string (++suffix);

    return nameToUse;
}